

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

xmlCharEncodingHandlerPtr xmlFindCharEncodingHandler(char *name)

{
  int iVar1;
  xmlCharEncodingHandlerPtr local_20;
  xmlCharEncodingHandler *ret;
  char *name_local;
  
  ret = (xmlCharEncodingHandler *)name;
  iVar1 = xmlStrcasecmp((xmlChar *)name,"UTF-8");
  if ((iVar1 != 0) && (iVar1 = xmlStrcasecmp((xmlChar *)ret,(xmlChar *)"UTF8"), iVar1 != 0)) {
    xmlOpenCharEncodingHandler((char *)ret,0,&local_20);
    return local_20;
  }
  return defaultHandlers + 1;
}

Assistant:

xmlCharEncodingHandlerPtr
xmlFindCharEncodingHandler(const char *name) {
    xmlCharEncodingHandler *ret;

    /*
     * This handler shouldn't be used, but we must return a non-NULL
     * handler.
     */
    if ((xmlStrcasecmp(BAD_CAST name, BAD_CAST "UTF-8") == 0) ||
        (xmlStrcasecmp(BAD_CAST name, BAD_CAST "UTF8") == 0))
        return((xmlCharEncodingHandlerPtr)
                &defaultHandlers[XML_CHAR_ENCODING_UTF8]);

    xmlOpenCharEncodingHandler(name, 0, &ret);
    return(ret);
}